

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildBrInt1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 relativeOffset,RegSlot src
          )

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegSlot srcRegSlot;
  uint uVar3;
  undefined4 *puVar4;
  RegOpnd *this_00;
  BranchInstr *branchInstr;
  int iVar5;
  undefined6 in_register_00000032;
  OpCode opcode;
  
  iVar5 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar5 == 0x26) {
    opcode = BrTrue_I4;
  }
  else if (iVar5 == 0x27) {
    opcode = BrFalse_I4;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xbae,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    opcode = Nop;
  }
  srcRegSlot = GetRegSlotFromTypedReg(this,src,INT32);
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  uVar3 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  branchInstr = IR::BranchInstr::New(opcode,(LabelInstr *)0x0,&this_00->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr,offset,relativeOffset + uVar3);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildBrInt1(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 relativeOffset, Js::RegSlot src)
{
    Js::OpCode op = Js::OpCode::Nop;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::BrTrue_Int:
        op = Js::OpCode::BrTrue_I4;
        break;
    case Js::OpCodeAsmJs::BrFalse_Int:
        op = Js::OpCode::BrFalse_I4;
        break;
    default:
        Assume(UNREACHED);
    }
    Js::RegSlot src1RegSlot = GetRegSlotFromIntReg(src);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt32);
    src1Opnd->SetValueType(ValueType::GetInt(false));

    uint targetOffset = m_jnReader.GetCurrentOffset() + relativeOffset;

    IR::BranchInstr * branchInstr = IR::BranchInstr::New(op, nullptr, src1Opnd, m_func);
    AddBranchInstr(branchInstr, offset, targetOffset);
}